

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::TextFlow::Column::const_iterator::const_iterator(const_iterator *this,Column *column)

{
  Column *pCVar1;
  pointer pcVar2;
  size_type sVar3;
  const_iterator cVar4;
  
  this->m_column = column;
  cVar4 = AnsiSkippingString::begin(&column->m_string);
  this->m_lineStart = cVar4;
  cVar4 = AnsiSkippingString::begin(&column->m_string);
  this->m_lineEnd = cVar4;
  cVar4 = AnsiSkippingString::begin(&column->m_string);
  this->m_parsedTo = cVar4;
  this->m_addHyphen = false;
  calcLength(this);
  if ((this->m_lineStart).m_it._M_current == (this->m_lineEnd).m_it._M_current) {
    pCVar1 = this->m_column;
    pcVar2 = (pCVar1->m_string).m_string._M_dataplus._M_p;
    sVar3 = (pCVar1->m_string).m_string._M_string_length;
    (this->m_lineStart).m_string = (string *)pCVar1;
    (this->m_lineStart).m_it._M_current = pcVar2 + sVar3;
  }
  return;
}

Assistant:

Column::const_iterator::const_iterator( Column const& column ):
            m_column( column ),
            m_lineStart( column.m_string.begin() ),
            m_lineEnd( column.m_string.begin() ),
            m_parsedTo( column.m_string.begin() ) {
            assert( m_column.m_width > m_column.m_indent );
            assert( m_column.m_initialIndent == std::string::npos ||
                    m_column.m_width > m_column.m_initialIndent );
            calcLength();
            if ( m_lineStart == m_lineEnd ) {
                m_lineStart = m_column.m_string.end();
            }
        }